

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyStrToReal(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  int iVar1;
  sxi32 sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  double local_58;
  sxreal dec;
  sxreal *p;
  sxi32 exp;
  sxi32 Lim;
  char *zEnd;
  sxreal Val;
  sxu8 neg;
  char **zRest_local;
  void *pOutVal_local;
  char *pcStack_10;
  sxu32 nLen_local;
  char *zSrc_local;
  
  bVar7 = false;
  zEnd = (char *)0x0;
  pcVar3 = zSrc + nLen;
  pcStack_10 = zSrc;
  while( true ) {
    bVar6 = false;
    if (pcStack_10 < pcVar3) {
      ppuVar4 = __ctype_b_loc();
      bVar6 = ((*ppuVar4)[(int)*pcStack_10] & 0x2000) != 0;
    }
    if (!bVar6) break;
    pcStack_10 = pcStack_10 + 1;
  }
  if ((pcStack_10 < pcVar3) && ((*pcStack_10 == '-' || (*pcStack_10 == '+')))) {
    bVar7 = *pcStack_10 == '-';
    pcStack_10 = pcStack_10 + 1;
  }
  p._4_4_ = 0xf;
  while (((iVar1 = p._4_4_, pcVar5 = pcStack_10, pcStack_10 < pcVar3 && (p._4_4_ != 0)) &&
         (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*pcStack_10] & 0x800) != 0))) {
    zEnd = (char *)((double)zEnd * 10.0 + (double)(*pcStack_10 + -0x30));
    pcVar5 = pcStack_10 + 1;
    iVar1 = p._4_4_ + -1;
    if (((pcVar3 <= pcVar5) || (iVar1 == 0)) ||
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*pcVar5] & 0x800) == 0)) break;
    zEnd = (char *)((double)zEnd * 10.0 + (double)(*pcVar5 + -0x30));
    pcVar5 = pcStack_10 + 2;
    iVar1 = p._4_4_ + -2;
    if (((pcVar3 <= pcVar5) || (iVar1 == 0)) ||
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*pcVar5] & 0x800) == 0)) break;
    zEnd = (char *)((double)zEnd * 10.0 + (double)(*pcVar5 + -0x30));
    pcVar5 = pcStack_10 + 3;
    iVar1 = p._4_4_ + -3;
    if (((pcVar3 <= pcVar5) || (iVar1 == 0)) ||
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*pcVar5] & 0x800) == 0)) break;
    zEnd = (char *)((double)zEnd * 10.0 + (double)(*pcVar5 + -0x30));
    pcStack_10 = pcStack_10 + 4;
    p._4_4_ = p._4_4_ + -4;
  }
  pcStack_10 = pcVar5;
  p._4_4_ = iVar1;
  if ((pcStack_10 < pcVar3) && ((*pcStack_10 == '.' || (*pcStack_10 == ',')))) {
    local_58 = 1.0;
    pcStack_10 = pcStack_10 + 1;
    while (((iVar1 = p._4_4_, pcVar5 = pcStack_10, pcStack_10 < pcVar3 && (p._4_4_ != 0)) &&
           (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*pcStack_10] & 0x800) != 0))) {
      zEnd = (char *)((double)zEnd * 10.0 + (double)(*pcStack_10 + -0x30));
      local_58 = local_58 * 10.0;
      pcVar5 = pcStack_10 + 1;
      iVar1 = p._4_4_ + -1;
      if (((pcVar3 <= pcVar5) || (iVar1 == 0)) ||
         (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*pcVar5] & 0x800) == 0)) break;
      zEnd = (char *)((double)zEnd * 10.0 + (double)(*pcVar5 + -0x30));
      local_58 = local_58 * 10.0;
      pcVar5 = pcStack_10 + 2;
      iVar1 = p._4_4_ + -2;
      if (((pcVar3 <= pcVar5) || (iVar1 == 0)) ||
         (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*pcVar5] & 0x800) == 0)) break;
      zEnd = (char *)((double)zEnd * 10.0 + (double)(*pcVar5 + -0x30));
      local_58 = local_58 * 10.0;
      pcVar5 = pcStack_10 + 3;
      iVar1 = p._4_4_ + -3;
      if (((pcVar3 <= pcVar5) || (iVar1 == 0)) ||
         (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*pcVar5] & 0x800) == 0)) break;
      zEnd = (char *)((double)zEnd * 10.0 + (double)(*pcVar5 + -0x30));
      local_58 = local_58 * 10.0;
      pcStack_10 = pcStack_10 + 4;
      p._4_4_ = p._4_4_ + -4;
    }
    pcStack_10 = pcVar5;
    p._4_4_ = iVar1;
    zEnd = (char *)((double)zEnd / local_58);
  }
  if ((bVar7) && (((double)zEnd != 0.0 || (NAN((double)zEnd))))) {
    zEnd = (char *)((ulong)zEnd ^ 0x8000000000000000);
  }
  if (p._4_4_ < 1) {
    for (; ((pcStack_10 < pcVar3 && (*pcStack_10 != 'e')) && (*pcStack_10 != 'E'));
        pcStack_10 = pcStack_10 + 1) {
    }
  }
  bVar7 = false;
  if ((pcStack_10 < pcVar3) && ((*pcStack_10 == 'e' || (*pcStack_10 == 'E')))) {
    pcVar5 = pcStack_10 + 1;
    if ((pcVar5 < pcVar3) && ((*pcVar5 == '-' || (*pcVar5 == '+')))) {
      bVar7 = *pcVar5 == '-';
      pcVar5 = pcStack_10 + 2;
    }
    pcStack_10 = pcVar5;
    p._0_4_ = 0;
    while( true ) {
      bVar6 = false;
      if (pcStack_10 < pcVar3) {
        ppuVar4 = __ctype_b_loc();
        bVar6 = false;
        if (((*ppuVar4)[(int)*pcStack_10] & 0x800) != 0) {
          bVar6 = (int)(uint)p < 0x134;
        }
      }
      if (!bVar6) break;
      p._0_4_ = (uint)p * 10 + *pcStack_10 + -0x30;
      pcStack_10 = pcStack_10 + 1;
    }
    if (bVar7) {
      if (0x133 < (int)(uint)p) {
        p._0_4_ = 0x133;
      }
    }
    else if (0x134 < (int)(uint)p) {
      p._0_4_ = 0x134;
    }
    dec = (sxreal)SyStrToReal::aTab;
    for (; (uint)p != 0; p._0_4_ = (int)(uint)p >> 1) {
      if (((uint)p & 1) != 0) {
        if (bVar7) {
          zEnd = (char *)((double)zEnd / *(double *)dec);
        }
        else {
          zEnd = (char *)(*(double *)dec * (double)zEnd);
        }
      }
      dec = (sxreal)((long)dec + 8);
    }
  }
  while( true ) {
    bVar7 = false;
    if (pcStack_10 < pcVar3) {
      ppuVar4 = __ctype_b_loc();
      bVar7 = ((*ppuVar4)[(int)*pcStack_10] & 0x2000) != 0;
    }
    if (!bVar7) break;
    pcStack_10 = pcStack_10 + 1;
  }
  if (zRest != (char **)0x0) {
    *zRest = pcStack_10;
  }
  if (pOutVal != (void *)0x0) {
    *(char **)pOutVal = zEnd;
  }
  sVar2 = -0xc;
  if (pcVar3 <= pcStack_10) {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToReal(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
#define SXDBL_DIG        15
#define SXDBL_MAX_EXP    308
#define SXDBL_MIN_EXP_PLUS	307
	static const sxreal aTab[] = {
	10, 
	1.0e2, 
	1.0e4, 
	1.0e8, 
	1.0e16, 
	1.0e32, 
	1.0e64, 
	1.0e128, 
	1.0e256
	};
	sxu8 neg = FALSE;
	sxreal Val = 0.0;
	const char *zEnd;
	sxi32 Lim, exp;
	sxreal *p = 0;
#ifdef UNTRUST
	if( SX_EMPTY_STR(zSrc)  ){
		if( pOutVal ){
			*(sxreal *)pOutVal = 0.0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++; 
	}
	if( zSrc < zEnd && (zSrc[0] == '-' || zSrc[0] == '+' ) ){
		neg =  zSrc[0] == '-' ? TRUE : FALSE ;
		zSrc++;
	}
	Lim = SXDBL_DIG ;
	for(;;){
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
	}
	if( zSrc < zEnd && ( zSrc[0] == '.' || zSrc[0] == ',' ) ){
		sxreal dec = 1.0;
		zSrc++;
		for(;;){
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
		}
		Val /= dec;
	}
	if( neg == TRUE && Val != 0.0 ) {
		Val = -Val ; 
	}
	if( Lim <= 0 ){
		/* jump overflow digit */
		while( zSrc < zEnd ){
			if( zSrc[0] == 'e' || zSrc[0] == 'E' ){
				break;  
			}
			zSrc++;
		}
	}
	neg = FALSE;
	if( zSrc < zEnd && ( zSrc[0] == 'e' || zSrc[0] == 'E' ) ){
		zSrc++;
		if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+') ){
			neg = zSrc[0] == '-' ? TRUE : FALSE ;
			zSrc++;
		}
		exp = 0;
		while( zSrc < zEnd && SyisDigit(zSrc[0]) && exp < SXDBL_MAX_EXP ){
			exp = exp * 10 + (zSrc[0] - '0');
			zSrc++;
		}
		if( neg  ){
			if( exp > SXDBL_MIN_EXP_PLUS ) exp = SXDBL_MIN_EXP_PLUS ;
		}else if ( exp > SXDBL_MAX_EXP ){
			exp = SXDBL_MAX_EXP; 
		}		
		for( p = (sxreal *)aTab ; exp ; exp >>= 1 , p++ ){
			if( exp & 01 ){
				if( neg ){
					Val /= *p ;
				}else{
					Val *= *p;
				}
			}
		}
	}
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc; 
	}
	if( pOutVal ){
		*(sxreal *)pOutVal = Val;
	}
	return zSrc >= zEnd ? SXRET_OK : SXERR_SYNTAX;
}